

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void SendConAck(int num_connected,int num_needed)

{
  int local_58;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  int node;
  PreGamePacket packet;
  int num_needed_local;
  int num_connected_local;
  
  local_54 = 0x30;
  local_53 = 4;
  local_52 = (undefined1)num_needed;
  local_51 = (undefined1)num_connected;
  packet.machines[7].address = num_needed;
  packet.machines[7]._4_4_ = num_connected;
  for (local_58 = 1; local_58 < doomcom.numnodes; local_58 = local_58 + 1) {
    PreSend(&local_54,4,sendaddress + local_58);
  }
  (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)(uint)(int)doomcom.numnodes);
  return;
}

Assistant:

static void SendConAck (int num_connected, int num_needed)
{
	PreGamePacket packet;

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONACK;
	packet.NumNodes = num_needed;
	packet.NumPresent = num_connected;
	for (int node = 1; node < doomcom.numnodes; ++node)
	{
		PreSend (&packet, 4, &sendaddress[node]);
	}
	StartScreen->NetProgress (doomcom.numnodes);
}